

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkMarkCone_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFlops)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_24;
  int iFanin;
  int i;
  Vec_Int_t *vFlops_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((*(ushort *)pObj >> 7 & 1) == 0) {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f | 0x80;
    iVar1 = Wlc_ObjIsCi(pObj);
    if (iVar1 == 0) {
      for (local_24 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
        iVar1 = Wlc_ObjFaninId(pObj,local_24);
        if (iVar1 != 0) {
          pObj_00 = Wlc_NtkObj(p,iVar1);
          Wlc_NtkMarkCone_rec(p,pObj_00,vFlops);
        }
      }
    }
    else {
      iVar1 = Wlc_ObjIsPi(pObj);
      if (iVar1 == 0) {
        iVar1 = Wlc_ObjCiId(pObj);
        Vec_IntPush(vFlops,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkMarkCone_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( !Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vFlops, Wlc_ObjCiId(pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i ) if ( iFanin )
        Wlc_NtkMarkCone_rec( p, Wlc_NtkObj(p, iFanin), vFlops );
}